

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void SEM_Ext_SEMI(attr *a,ast *node)

{
  ast *node_local;
  attr *a_local;
  
  return;
}

Assistant:

static void SEM_Ext_SEMI(struct attr *a, struct ast *node) {
//    if (a->kind == STRUCTURE && a->structure->name) {
//        if (insertvar(a->structure->name, a) == 0) { //DONETODO: error insert
//            printf("error insert structure %s\n", a->structure->name);
//            SEMERROR(DuplicatedStructName, node, a->structure->name);
//        }
//    }
}